

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatProviders.h
# Opt level: O1

bool llvm::detail::HelperFunctions::consumeHexStyle(StringRef *Str,HexPrintStyle *Style)

{
  bool bVar1;
  bool bVar2;
  HexPrintStyle HVar3;
  StringRef Prefix;
  StringRef Prefix_00;
  StringRef Prefix_01;
  StringRef Prefix_02;
  StringRef Prefix_03;
  StringRef Prefix_04;
  StringRef Prefix_05;
  
  Prefix.Length = 1;
  Prefix.Data = "x";
  bVar1 = StringRef::startswith_lower(Str,Prefix);
  if (bVar1) {
    Prefix_00.Length = 2;
    Prefix_00.Data = "x-";
    bVar2 = StringRef::consume_front(Str,Prefix_00);
    HVar3 = Lower;
    if (!bVar2) {
      Prefix_01.Length = 2;
      Prefix_01.Data = "X-";
      bVar2 = StringRef::consume_front(Str,Prefix_01);
      HVar3 = Upper;
      if (!bVar2) {
        Prefix_02.Length = 2;
        Prefix_02.Data = "x+";
        bVar2 = StringRef::consume_front(Str,Prefix_02);
        HVar3 = PrefixLower;
        if ((!bVar2) &&
           (Prefix_03.Length = 1, Prefix_03.Data = "x",
           bVar2 = StringRef::consume_front(Str,Prefix_03), !bVar2)) {
          Prefix_04.Length = 2;
          Prefix_04.Data = "X+";
          bVar2 = StringRef::consume_front(Str,Prefix_04);
          HVar3 = PrefixUpper;
          if ((!bVar2) &&
             (Prefix_05.Length = 1, Prefix_05.Data = "X",
             bVar2 = StringRef::consume_front(Str,Prefix_05), !bVar2)) {
            return bVar1;
          }
        }
      }
    }
    *Style = HVar3;
  }
  return bVar1;
}

Assistant:

static bool consumeHexStyle(StringRef &Str, HexPrintStyle &Style) {
    if (!Str.startswith_lower("x"))
      return false;

    if (Str.consume_front("x-"))
      Style = HexPrintStyle::Lower;
    else if (Str.consume_front("X-"))
      Style = HexPrintStyle::Upper;
    else if (Str.consume_front("x+") || Str.consume_front("x"))
      Style = HexPrintStyle::PrefixLower;
    else if (Str.consume_front("X+") || Str.consume_front("X"))
      Style = HexPrintStyle::PrefixUpper;
    return true;
  }